

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

bool __thiscall
miniros::MasterLink::getParamNames
          (MasterLink *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  undefined1 uVar1;
  byte bVar2;
  Error EVar3;
  int iVar4;
  int iVar5;
  Type *pTVar6;
  XmlRpcValue *this_00;
  reference this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  int i;
  RpcValue parameters;
  RpcValue payload;
  RpcValue result;
  RpcValue params;
  bool in_stack_00000187;
  RpcValue *in_stack_00000188;
  RpcValue *in_stack_00000190;
  RpcValue *in_stack_00000198;
  string *in_stack_000001a0;
  MasterLink *in_stack_000001a8;
  string *in_stack_fffffffffffffeb8;
  int i_00;
  XmlRpcValue *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  XmlRpcValue *in_stack_fffffffffffffee0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  allocator<char> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff08;
  string local_d0 [36];
  int local_ac;
  undefined4 local_98;
  allocator<char> local_91;
  string local_90 [36];
  Error local_6c [5];
  XmlRpcValue local_58 [2];
  XmlRpcValue local_38;
  XmlRpcValue local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_28);
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_38);
  XmlRpc::XmlRpcValue::XmlRpcValue(local_58);
  this_node::getName_abi_cxx11_();
  XmlRpc::XmlRpcValue::XmlRpcValue
            (in_stack_fffffffffffffee0,
             (string *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  XmlRpc::XmlRpcValue::operator[]
            (in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  XmlRpc::XmlRpcValue::operator=
            ((XmlRpcValue *)in_stack_ffffffffffffff00,
             (XmlRpcValue *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x45d936);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,
             (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0);
  EVar3 = execute(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                  in_stack_00000188,in_stack_00000187);
  local_6c[0] = EVar3;
  uVar1 = Error::operator_cast_to_bool(local_6c);
  bVar2 = uVar1 ^ 0xff;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  if ((bVar2 & 1) == 0) {
    pTVar6 = XmlRpc::XmlRpcValue::getType(&local_38);
    if (*pTVar6 == TypeArray) {
      iVar4 = XmlRpc::XmlRpcValue::size
                        ((XmlRpcValue *)
                         CONCAT44(EVar3.code,
                                  CONCAT13(uVar1,CONCAT12(bVar2,in_stack_ffffffffffffff08))));
      if (iVar4 == 3) {
        XmlRpc::XmlRpcValue::operator[]
                  (in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        XmlRpc::XmlRpcValue::XmlRpcValue
                  (in_stack_fffffffffffffec0,(XmlRpcValue *)in_stack_fffffffffffffeb8);
        this_02 = local_18;
        XmlRpc::XmlRpcValue::size
                  ((XmlRpcValue *)
                   CONCAT44(EVar3.code,CONCAT13(uVar1,CONCAT12(bVar2,in_stack_ffffffffffffff08))));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(this_02,CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        local_ac = 0;
        while( true ) {
          i_00 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
          iVar4 = local_ac;
          iVar5 = XmlRpc::XmlRpcValue::size
                            ((XmlRpcValue *)
                             CONCAT44(EVar3.code,
                                      CONCAT13(uVar1,CONCAT12(bVar2,in_stack_ffffffffffffff08))));
          if (iVar5 <= iVar4) break;
          this_00 = XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffec0,i_00);
          pTVar6 = XmlRpc::XmlRpcValue::getType(this_00);
          if (*pTVar6 != TypeString) {
            local_1 = 0;
            goto LAB_0045dcbe;
          }
          in_stack_fffffffffffffec0 =
               XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffec0,i_00);
          in_stack_fffffffffffffeb8 =
               XmlRpc::XmlRpcValue::operator_cast_to_string_(in_stack_fffffffffffffec0);
          std::__cxx11::string::string(local_d0,(string *)in_stack_fffffffffffffeb8);
          this_01 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](local_18,(long)local_ac);
          std::__cxx11::string::operator=((string *)this_01,local_d0);
          std::__cxx11::string::~string(local_d0);
          local_ac = local_ac + 1;
        }
        local_1 = 1;
LAB_0045dcbe:
        local_98 = 1;
        XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x45dccb);
      }
      else {
        local_1 = 0;
        local_98 = 1;
      }
    }
    else {
      local_1 = 0;
      local_98 = 1;
    }
  }
  else {
    local_1 = 0;
    local_98 = 1;
  }
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x45dcd8);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x45dce5);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x45dcf2);
  return (bool)(local_1 & 1);
}

Assistant:

bool MasterLink::getParamNames(std::vector<std::string>& keys)
{
  RpcValue params, result, payload;
  params[0] = this_node::getName();
  if (!this->execute("getParamNames", params, result, payload, false)) {
    return false;
  }
  // Make sure it's an array type
  if (result.getType() != RpcValue::TypeArray) {
    return false;
  }
  // Make sure it returned 3 elements
  if (result.size() != 3) {
    return false;
  }
  // Get the actual parameter keys
  RpcValue parameters = result[2];
  // Resize the output
  keys.resize(parameters.size());

  // Fill the output vector with the answer
  for (int i = 0; i < parameters.size(); ++i) {
    if (parameters[i].getType() != RpcValue::TypeString) {
      return false;
    }
    keys[i] = std::string(parameters[i]);
  }
  return true;
}